

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O1

sljit_s32 sljit_emit_fast_enter(sljit_compiler *compiler,sljit_s32 dst,sljit_sw dstw)

{
  sljit_s32 in_EAX;
  sljit_u8 *psVar1;
  ulong uVar2;
  
  if (compiler->error == 0) {
    uVar2 = (ulong)(uint)dst;
    if (dst < 0x40) {
      if ((0xe21fUL >> (uVar2 & 0x3f) & 1) == 0) {
        psVar1 = (sljit_u8 *)ensure_buf(compiler,3);
        if (psVar1 != (sljit_u8 *)0x0) {
          *psVar1 = '\x02';
          compiler->size = compiler->size + 2;
          psVar1[1] = 'A';
          psVar1[2] = ""[uVar2] + 'X';
        }
      }
      else {
        psVar1 = (sljit_u8 *)ensure_buf(compiler,2);
        if (psVar1 != (sljit_u8 *)0x0) {
          *psVar1 = '\x01';
          compiler->size = compiler->size + 1;
          psVar1[1] = ""[uVar2] + 'X';
        }
      }
    }
    else {
      compiler->mode32 = 1;
      psVar1 = emit_x86_instruction(compiler,1,0,0,dst,0);
      if (psVar1 != (sljit_u8 *)0x0) {
        *psVar1 = 0x8f;
      }
    }
    in_EAX = (sljit_s32)psVar1;
  }
  return in_EAX;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_fast_enter(struct sljit_compiler *compiler, sljit_s32 dst, sljit_sw dstw)
{
	sljit_u8 *inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_fast_enter(compiler, dst, dstw));
	ADJUST_LOCAL_OFFSET(dst, dstw);

	/* For UNUSED dst. Uncommon, but possible. */
	if (dst == SLJIT_UNUSED)
		dst = TMP_REG1;

	if (FAST_IS_REG(dst)) {
		if (reg_map[dst] < 8) {
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 1);
			FAIL_IF(!inst);
			INC_SIZE(1);
			POP_REG(reg_lmap[dst]);
			return SLJIT_SUCCESS;
		}

		inst = (sljit_u8*)ensure_buf(compiler, 1 + 2);
		FAIL_IF(!inst);
		INC_SIZE(2);
		*inst++ = REX_B;
		POP_REG(reg_lmap[dst]);
		return SLJIT_SUCCESS;
	}

	/* REX_W is not necessary (src is not immediate). */
	compiler->mode32 = 1;
	inst = emit_x86_instruction(compiler, 1, 0, 0, dst, dstw);
	FAIL_IF(!inst);
	*inst++ = POP_rm;
	return SLJIT_SUCCESS;
}